

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O2

Result<wallet::SelectionResult> *
wallet::KnapsackSolver
          (Result<wallet::SelectionResult> *__return_storage_ptr__,
          vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *groups,
          CAmount *nTargetValue,CAmount change_target,FastRandomContext *rng,
          int max_selection_weight)

{
  long lVar1;
  value_type *pvVar2;
  bool bVar3;
  long lVar4;
  pointer pcVar5;
  pointer pOVar6;
  OutputGroup *group;
  value_type *group_00;
  pointer group_01;
  long lVar7;
  ulong uVar8;
  OutputGroup *group_02;
  char *pcVar9;
  FastRandomContext *this;
  SelectionResult *this_00;
  string *this_01;
  uint uVar10;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  int iterations;
  CAmount nBest;
  vector<char,_std::allocator<char>_> vfBest;
  long local_3a0;
  vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> applicable_groups;
  optional<wallet::OutputGroup> lowest_larger;
  SelectionResult local_308;
  string local_298;
  string local_278;
  string log_message;
  SelectionResult local_238;
  bilingual_str local_1c8;
  SelectionResult local_188;
  SelectionResult local_118;
  SelectionResult result;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  result.m_target = *nTargetValue;
  result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
  result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  result.m_algo = KNAPSACK;
  result.m_use_effective = false;
  result.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  result.m_algo_completed = true;
  result.m_weight = 0;
  result.bump_fee_group_discount = 0;
  lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
  super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
  super__Optional_payload_base<wallet::OutputGroup>._M_engaged = false;
  applicable_groups.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  applicable_groups.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  applicable_groups.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  shuffle<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,FastRandomContext&>
            ((groups->super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>)
             ._M_impl.super__Vector_impl_data._M_start,
             (groups->super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>)
             ._M_impl.super__Vector_impl_data._M_finish,rng);
  pvVar2 = (groups->super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  lVar7 = 0;
  bVar3 = false;
  for (group_00 = (groups->
                  super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
                  _M_impl.super__Vector_impl_data._M_start;
      pOVar6 = applicable_groups.
               super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl
               .super__Vector_impl_data._M_finish, group_00 != pvVar2; group_00 = group_00 + 1) {
    if (max_selection_weight < group_00->m_weight) {
      bVar3 = true;
    }
    else {
      lVar4 = *(long *)((long)&group_00->m_value +
                       (ulong)((group_00->m_subtract_fee_outputs ^ 1) << 5));
      if (lVar4 == *nTargetValue) {
        SelectionResult::AddInput(&result,group_00);
        SelectionResult::SelectionResult(&local_118,&result);
        std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::SelectionResult>::
        _Variant_storage<1ul,wallet::SelectionResult>
                  ((_Variant_storage<false,bilingual_str,wallet::SelectionResult> *)
                   __return_storage_ptr__,&local_118);
        this_00 = &local_118;
        goto LAB_0022337f;
      }
      if (lVar4 < *nTargetValue + change_target) {
        std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::push_back
                  (&applicable_groups,group_00);
        lVar7 = lVar7 + *(long *)((long)&group_00->m_value +
                                 (ulong)((group_00->m_subtract_fee_outputs ^ 1) << 5));
      }
      else if ((lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
                super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
                super__Optional_payload_base<wallet::OutputGroup>._M_engaged != true) ||
              (lVar4 < *(long *)((long)&lowest_larger.
                                        super__Optional_base<wallet::OutputGroup,_false,_false>.
                                        _M_payload.
                                        super__Optional_payload<wallet::OutputGroup,_true,_false,_false>
                                        .super__Optional_payload_base<wallet::OutputGroup>.
                                        _M_payload +
                                (ulong)((lowest_larger.
                                         super__Optional_base<wallet::OutputGroup,_false,_false>.
                                         _M_payload.
                                         super__Optional_payload<wallet::OutputGroup,_true,_false,_false>
                                         .super__Optional_payload_base<wallet::OutputGroup>.
                                         _M_payload._M_value.m_subtract_fee_outputs ^ 1) << 5) +
                                0x20))) {
        std::optional<wallet::OutputGroup>::operator=(&lowest_larger,group_00);
      }
    }
  }
  lVar4 = *nTargetValue;
  local_3a0 = lVar7;
  if (lVar7 == lVar4) {
    for (group_01 = applicable_groups.
                    super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                    _M_impl.super__Vector_impl_data._M_start; group_01 != pOVar6;
        group_01 = group_01 + 1) {
      SelectionResult::AddInput(&result,group_01);
    }
    if (max_selection_weight < result.m_weight) {
      SelectionResult::Clear(&result);
      lVar4 = *nTargetValue;
      bVar3 = true;
      goto LAB_00223197;
    }
    SelectionResult::SelectionResult(&local_188,&result);
    std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::SelectionResult>::
    _Variant_storage<1ul,wallet::SelectionResult>
              ((_Variant_storage<false,bilingual_str,wallet::SelectionResult> *)
               __return_storage_ptr__,&local_188);
    this_00 = &local_188;
  }
  else {
LAB_00223197:
    if (lVar4 <= lVar7) {
      iterations = 0x223241;
      std::
      sort<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,wallet::__0>
                (applicable_groups.
                 super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 applicable_groups.
                 super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      vfBest.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      vfBest.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      vfBest.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      this = rng;
      ApproximateBestSubset
                (rng,&applicable_groups,&local_3a0,nTargetValue,&vfBest,&nBest,max_selection_weight,
                 iterations);
      if ((nBest != *nTargetValue) &&
         (pcVar5 = (pointer)(*nTargetValue + change_target), (long)pcVar5 <= lVar7)) {
        log_message._M_dataplus._M_p = pcVar5;
        ApproximateBestSubset
                  (rng,&applicable_groups,&local_3a0,(CAmount *)&log_message,&vfBest,&nBest,
                   max_selection_weight,iterations);
        this = rng;
      }
      if ((lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
           super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
           super__Optional_payload_base<wallet::OutputGroup>._M_engaged == false) ||
         ((nBest == *nTargetValue || change_target + *nTargetValue <= nBest &&
          (nBest < *(long *)((long)&lowest_larger.
                                    super__Optional_base<wallet::OutputGroup,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<wallet::OutputGroup,_true,_false,_false>
                                    .super__Optional_payload_base<wallet::OutputGroup>._M_payload +
                            (ulong)((lowest_larger.
                                     super__Optional_base<wallet::OutputGroup,_false,_false>.
                                     _M_payload.
                                     super__Optional_payload<wallet::OutputGroup,_true,_false,_false>
                                     .super__Optional_payload_base<wallet::OutputGroup>._M_payload.
                                     _M_value.m_subtract_fee_outputs ^ 1) << 5) + 0x20))))) {
        uVar10 = 0;
        while( true ) {
          uVar8 = (ulong)uVar10;
          if ((ulong)(((long)applicable_groups.
                             super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)applicable_groups.
                            super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x68) <= uVar8) break;
          if (vfBest.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar8] != '\0') {
            this = (FastRandomContext *)&result;
            SelectionResult::AddInput
                      (&result,applicable_groups.
                               super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar8);
          }
          uVar10 = uVar10 + 1;
        }
        group_02 = applicable_groups.
                   super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        if (result.m_weight <= max_selection_weight) {
LAB_002233be:
          bVar3 = LogAcceptCategory((LogFlags)this,(Level)group_02);
          if (bVar3) {
            pcVar9 = "Coin selection best subset: ";
            this_01 = &log_message;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)this_01,"Coin selection best subset: ",
                       (allocator<char> *)&local_278);
            uVar10 = 0;
            while( true ) {
              uVar8 = (ulong)uVar10;
              if ((ulong)(((long)applicable_groups.
                                 super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)applicable_groups.
                                super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x68) <= uVar8) break;
              if (vfBest.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar8] != '\0') {
                pOVar6 = applicable_groups.
                         super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                FormatMoney_abi_cxx11_
                          (&local_298,
                           applicable_groups.
                           super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar8].m_value);
                tinyformat::format<std::__cxx11::string>
                          (&local_278,(tinyformat *)0x400541,(char *)&local_298,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pOVar6);
                pcVar9 = (char *)&local_278;
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&log_message,&local_278);
                std::__cxx11::string::~string((string *)&local_278);
                this_01 = &local_298;
                std::__cxx11::string::~string((string *)&local_298);
              }
              uVar10 = uVar10 + 1;
            }
            bVar3 = LogAcceptCategory((LogFlags)this_01,(Level)pcVar9);
            if (bVar3) {
              FormatMoney_abi_cxx11_(&local_278,nBest);
              logging_function._M_str = "KnapsackSolver";
              logging_function._M_len = 0xe;
              source_file._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/coinselection.cpp"
              ;
              source_file._M_len = 0x68;
              LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                        (logging_function,source_file,0x2e7,SELECTCOINS,Debug,
                         (ConstevalFormatString<2U>)0x3fa8ec,&log_message,&local_278);
              std::__cxx11::string::~string((string *)&local_278);
            }
            std::__cxx11::string::~string((string *)&log_message);
          }
          goto LAB_00223558;
        }
        if (lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
            super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
            super__Optional_payload_base<wallet::OutputGroup>._M_engaged != false) {
          this = (FastRandomContext *)&result;
          SelectionResult::Clear((SelectionResult *)this);
          group_02 = (OutputGroup *)&lowest_larger;
          SelectionResult::AddInput((SelectionResult *)this,group_02);
          goto LAB_002233be;
        }
        ErrorMaxWeightExceeded();
      }
      else {
        SelectionResult::AddInput(&result,(OutputGroup *)&lowest_larger);
LAB_00223558:
        SelectionResult::SelectionResult(&local_308,&result);
        std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::SelectionResult>::
        _Variant_storage<1ul,wallet::SelectionResult>
                  ((_Variant_storage<false,bilingual_str,wallet::SelectionResult> *)
                   __return_storage_ptr__,&local_308);
        _GLOBAL__N_1::std::
        _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
        ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                     *)&local_308);
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&vfBest.super__Vector_base<char,_std::allocator<char>_>);
      goto LAB_00223593;
    }
    if (lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
        super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
        super__Optional_payload_base<wallet::OutputGroup>._M_engaged == false) {
      if (bVar3) {
        ErrorMaxWeightExceeded();
      }
      else {
        local_1c8.original._M_dataplus._M_p = (pointer)&local_1c8.original.field_2;
        local_1c8.translated._M_string_length = 0;
        local_1c8.translated.field_2._8_8_ = 0;
        local_1c8.original.field_2._M_allocated_capacity = 0;
        local_1c8.original.field_2._8_8_ = 0;
        local_1c8.original._M_string_length = 0;
        local_1c8.translated._M_dataplus._M_p = (pointer)&local_1c8.translated.field_2;
        local_1c8.translated.field_2._M_allocated_capacity = 0;
        std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::SelectionResult>::
        _Variant_storage<0ul,bilingual_str>
                  ((_Variant_storage<false,bilingual_str,wallet::SelectionResult> *)
                   __return_storage_ptr__,&local_1c8);
        bilingual_str::~bilingual_str(&local_1c8);
      }
      goto LAB_00223593;
    }
    SelectionResult::AddInput(&result,(OutputGroup *)&lowest_larger);
    SelectionResult::SelectionResult(&local_238,&result);
    std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::SelectionResult>::
    _Variant_storage<1ul,wallet::SelectionResult>
              ((_Variant_storage<false,bilingual_str,wallet::SelectionResult> *)
               __return_storage_ptr__,&local_238);
    this_00 = &local_238;
  }
LAB_0022337f:
  _GLOBAL__N_1::std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)this_00);
LAB_00223593:
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::~vector
            (&applicable_groups);
  std::_Optional_payload_base<wallet::OutputGroup>::_M_reset
            ((_Optional_payload_base<wallet::OutputGroup> *)&lowest_larger);
  _GLOBAL__N_1::std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&result);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<SelectionResult> KnapsackSolver(std::vector<OutputGroup>& groups, const CAmount& nTargetValue,
                                             CAmount change_target, FastRandomContext& rng, int max_selection_weight)
{
    SelectionResult result(nTargetValue, SelectionAlgorithm::KNAPSACK);

    bool max_weight_exceeded{false};
    // List of values less than target
    std::optional<OutputGroup> lowest_larger;
    // Groups with selection amount smaller than the target and any change we might produce.
    // Don't include groups larger than this, because they will only cause us to overshoot.
    std::vector<OutputGroup> applicable_groups;
    CAmount nTotalLower = 0;

    std::shuffle(groups.begin(), groups.end(), rng);

    for (const OutputGroup& group : groups) {
        if (group.m_weight > max_selection_weight) {
            max_weight_exceeded = true;
            continue;
        }
        if (group.GetSelectionAmount() == nTargetValue) {
            result.AddInput(group);
            return result;
        } else if (group.GetSelectionAmount() < nTargetValue + change_target) {
            applicable_groups.push_back(group);
            nTotalLower += group.GetSelectionAmount();
        } else if (!lowest_larger || group.GetSelectionAmount() < lowest_larger->GetSelectionAmount()) {
            lowest_larger = group;
        }
    }

    if (nTotalLower == nTargetValue) {
        for (const auto& group : applicable_groups) {
            result.AddInput(group);
        }
        if (result.GetWeight() <= max_selection_weight) return result;
        else max_weight_exceeded = true;

        // Try something else
        result.Clear();
    }

    if (nTotalLower < nTargetValue) {
        if (!lowest_larger) {
            if (max_weight_exceeded) return ErrorMaxWeightExceeded();
            return util::Error();
        }
        result.AddInput(*lowest_larger);
        return result;
    }

    // Solve subset sum by stochastic approximation
    std::sort(applicable_groups.begin(), applicable_groups.end(), descending);
    std::vector<char> vfBest;
    CAmount nBest;

    ApproximateBestSubset(rng, applicable_groups, nTotalLower, nTargetValue, vfBest, nBest, max_selection_weight);
    if (nBest != nTargetValue && nTotalLower >= nTargetValue + change_target) {
        ApproximateBestSubset(rng, applicable_groups, nTotalLower, nTargetValue + change_target, vfBest, nBest, max_selection_weight);
    }

    // If we have a bigger coin and (either the stochastic approximation didn't find a good solution,
    //                                   or the next bigger coin is closer), return the bigger coin
    if (lowest_larger &&
        ((nBest != nTargetValue && nBest < nTargetValue + change_target) || lowest_larger->GetSelectionAmount() <= nBest)) {
        result.AddInput(*lowest_larger);
    } else {
        for (unsigned int i = 0; i < applicable_groups.size(); i++) {
            if (vfBest[i]) {
                result.AddInput(applicable_groups[i]);
            }
        }

        // If the result exceeds the maximum allowed size, return closest UTXO above the target
        if (result.GetWeight() > max_selection_weight) {
            // No coin above target, nothing to do.
            if (!lowest_larger) return ErrorMaxWeightExceeded();

            // Return closest UTXO above target
            result.Clear();
            result.AddInput(*lowest_larger);
        }

        if (LogAcceptCategory(BCLog::SELECTCOINS, BCLog::Level::Debug)) {
            std::string log_message{"Coin selection best subset: "};
            for (unsigned int i = 0; i < applicable_groups.size(); i++) {
                if (vfBest[i]) {
                    log_message += strprintf("%s ", FormatMoney(applicable_groups[i].m_value));
                }
            }
            LogDebug(BCLog::SELECTCOINS, "%stotal %s\n", log_message, FormatMoney(nBest));
        }
    }
    Assume(result.GetWeight() <= max_selection_weight);
    return result;
}